

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O1

int ipc_helper_heavy_traffic_deadlock_bug(void)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  long *__size;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t pipe;
  long local_100;
  long local_f8;
  uv_stream_t local_f0;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&local_f0,1);
  local_f8 = (long)iVar1;
  local_100 = 0;
  if (local_f8 == 0) {
    iVar1 = uv_pipe_open(&local_f0,0);
    local_f8 = (long)iVar1;
    local_100 = 0;
    if (local_f8 == 0) {
      notify_parent_process();
      do_writes_and_reads(&local_f0);
      uv_sleep(100);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_f8 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      local_100 = (long)iVar1;
      if (local_f8 == local_100) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001a8064;
    }
  }
  else {
    ipc_helper_heavy_traffic_deadlock_bug_cold_1();
  }
  ipc_helper_heavy_traffic_deadlock_bug_cold_2();
LAB_001a8064:
  __size = &local_100;
  ipc_helper_heavy_traffic_deadlock_bug_cold_3();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = (long)(int)__size;
  return (int)__size;
}

Assistant:

int ipc_helper_heavy_traffic_deadlock_bug(void) {
  uv_pipe_t pipe;
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe, 1);
  ASSERT_OK(r);
  r = uv_pipe_open(&pipe, uv_convert_fd_to_handle(0));
  ASSERT_OK(r);

  notify_parent_process();
  do_writes_and_reads((uv_stream_t*) &pipe);
  uv_sleep(100);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}